

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

golf_entity_t *
golf_entity_ball_start(golf_entity_t *__return_storage_ptr__,char *name,golf_transform_t transform)

{
  golf_entity_t *entity;
  char *name_local;
  
  __return_storage_ptr__->active = true;
  __return_storage_ptr__->parent_idx = -1;
  __return_storage_ptr__->type = BALL_START_ENTITY;
  snprintf(__return_storage_ptr__->name,0x40,"%s",name);
  memcpy(&__return_storage_ptr__->field_4,&transform,0x28);
  return __return_storage_ptr__;
}

Assistant:

golf_entity_t golf_entity_ball_start(const char *name, golf_transform_t transform) {
    golf_entity_t entity;
    entity.active = true;
    entity.parent_idx = -1;
    entity.type = BALL_START_ENTITY;
    snprintf(entity.name, GOLF_MAX_NAME_LEN, "%s", name);
    entity.ball_start.transform = transform;
    return entity;
}